

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::e_formatter<spdlog::details::null_scoped_padder>::format
          (e_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,tm *param_3,
          memory_buf_t *dest)

{
  memory_buf_t *in_RCX;
  memory_buf_t *in_RDI;
  null_scoped_padder p;
  size_t field_size;
  duration<long,_std::ratio<1L,_1000L>_> millis;
  uint in_stack_ffffffffffffffc4;
  time_point in_stack_ffffffffffffffd8;
  
  fmt_helper::time_fraction<std::chrono::duration<long,std::ratio<1l,1000l>>>
            (in_stack_ffffffffffffffd8);
  null_scoped_padder::null_scoped_padder
            ((null_scoped_padder *)&stack0xffffffffffffffc7,3,(padding_info *)&in_RDI->field_0x8,
             in_RCX);
  std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count
            ((duration<long,_std::ratio<1L,_1000L>_> *)&stack0xffffffffffffffd8);
  fmt_helper::pad3<unsigned_int>(in_stack_ffffffffffffffc4,in_RDI);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        auto millis = fmt_helper::time_fraction<std::chrono::milliseconds>(msg.time);
        const size_t field_size = 3;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad3(static_cast<uint32_t>(millis.count()), dest);
    }